

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::searchdashwordlist(Forth *this)

{
  bool bVar1;
  uint wid_00;
  uint nameLength;
  uint nameToFind;
  Xt x;
  Definition *this_00;
  Cell x_00;
  Xt word;
  CAddr name;
  CAddr caddr;
  Cell length;
  Cell wid;
  Forth *this_local;
  
  requireDStackDepth(this,3,"SEARCH-WORDLIST");
  wid_00 = ForthStack<unsigned_int>::getTop(&this->dStack);
  pop(this);
  nameLength = ForthStack<unsigned_int>::getTop(&this->dStack);
  pop(this);
  nameToFind = ForthStack<unsigned_int>::getTop(&this->dStack);
  pop(this);
  x = findDefinitionByWid(this,nameToFind,nameLength,wid_00);
  if (x == 0) {
    push(this,0);
  }
  else {
    ForthStack<unsigned_int>::push(&this->dStack,x);
    this_00 = definitionsAt(this,x);
    bVar1 = Definition::isImmediate(this_00);
    x_00 = 0xffffffff;
    if (bVar1) {
      x_00 = 1;
    }
    push(this,x_00);
  }
  return;
}

Assistant:

void searchdashwordlist() {
			REQUIRE_DSTACK_DEPTH(3, "SEARCH-WORDLIST");
			auto wid = CELL(dStack.getTop()); pop();
			auto length = CELL(dStack.getTop()); pop();
			auto caddr = CADDR(dStack.getTop()); pop();
			//auto length = static_cast<Cell>(getDataChar(caddr));
			auto name = caddr;
			auto word = findDefinitionByWid(name, length,wid);
			if (word == 0) {
				push(0);
			}
			else {
				dStack.push(CELL(word));
				push(definitionsAt(word).isImmediate() ? 1 : Cell(-1));
			}
		}